

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handypack.hpp
# Opt level: O0

void NHandyPack::
     TVectorSerializer<std::vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>,_std::pair<unsigned_short,_unsigned_short>_>
     ::Dump(ostream *out,
           vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
           *object)

{
  vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
  *this;
  bool bVar1;
  size_type sVar2;
  reference t;
  pair<unsigned_short,_unsigned_short> *obj;
  const_iterator __end0;
  const_iterator __begin0;
  vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
  *__range2;
  vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
  *pvStack_18;
  uint32_t size;
  vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
  *object_local;
  ostream *out_local;
  
  pvStack_18 = object;
  object_local = (vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                  *)out;
  sVar2 = std::
          vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
          ::size(object);
  __range2._4_4_ = (undefined4)sVar2;
  std::ostream::write((char *)object_local,(long)&__range2 + 4);
  this = pvStack_18;
  __end0 = std::
           vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
           ::begin(pvStack_18);
  obj = (pair<unsigned_short,_unsigned_short> *)
        std::
        vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
        ::end(this);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_std::pair<unsigned_short,_unsigned_short>_*,_std::vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>_>
                                *)&obj);
    if (!bVar1) break;
    t = __gnu_cxx::
        __normal_iterator<const_std::pair<unsigned_short,_unsigned_short>_*,_std::vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>_>
        ::operator*(&__end0);
    Dump<std::pair<unsigned_short,unsigned_short>>((ostream *)object_local,t);
    __gnu_cxx::
    __normal_iterator<const_std::pair<unsigned_short,_unsigned_short>_*,_std::vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

static inline void Dump(std::ostream& out, const TVec& object) {
        uint32_t size = object.size();
        out.write((const char*)(&size), sizeof(size));
        for (const auto& obj: object) {
            NHandyPack::Dump(out, obj);
        }
    }